

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

void gpu_free_renderer_memory(GPU_Renderer *renderer)

{
  int local_14;
  int i;
  GPU_Renderer *renderer_local;
  
  if (renderer != (GPU_Renderer *)0x0) {
    for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
      if ((_gpu_renderer_register[local_14].id.renderer != 0) &&
         ((renderer->id).renderer == _gpu_renderer_register[local_14].id.renderer)) {
        (*_gpu_renderer_register[local_14].freeFn)(renderer);
        return;
      }
    }
  }
  return;
}

Assistant:

void gpu_free_renderer_memory(GPU_Renderer* renderer)
{
	int i;
	if(renderer == NULL)
        return;
	
	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer == GPU_RENDERER_UNKNOWN)
			continue;
		
		if(renderer->id.renderer == _gpu_renderer_register[i].id.renderer)
		{
			_gpu_renderer_register[i].freeFn(renderer);
			return;
		}
	}
}